

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

deBool qpTestLog_terminateCase(qpTestLog *log,qpTestResult result)

{
  char *pcVar1;
  bool bVar2;
  char *resultStr;
  qpTestResult result_local;
  qpTestLog *log_local;
  
  pcVar1 = qpLookupString(s_qpTestResultMap,0xb,result);
  deMutex_lock(log->lock);
  bVar2 = log->isCaseOpen != 0;
  if (bVar2) {
    qpXmlWriter_flush(log->writer);
    fprintf((FILE *)log->outputFile,"\n#terminateTestCaseResult %s\n",pcVar1);
    qpTestLog_flushFile(log);
    log->isCaseOpen = 0;
    deMutex_unlock(log->lock);
  }
  else {
    deMutex_unlock(log->lock);
  }
  log_local._4_4_ = (uint)bVar2;
  return log_local._4_4_;
}

Assistant:

deBool qpTestLog_terminateCase (qpTestLog* log, qpTestResult result)
{
	const char* resultStr = QP_LOOKUP_STRING(s_qpTestResultMap, result);

	DE_ASSERT(log);
	DE_ASSERT(result == QP_TEST_RESULT_CRASH || result == QP_TEST_RESULT_TIMEOUT);

	deMutex_lock(log->lock);

	if (!log->isCaseOpen)
	{
		deMutex_unlock(log->lock);
		return DE_FALSE; /* Soft error. This is called from error handler. */
	}

	/* Flush XML and write #terminateTestCaseResult. */
	qpXmlWriter_flush(log->writer);
	fprintf(log->outputFile, "\n#terminateTestCaseResult %s\n", resultStr);
	qpTestLog_flushFile(log);

	log->isCaseOpen = DE_FALSE;

#if defined(DE_DEBUG)
	ContainerStack_reset(&log->containerStack);
#endif

	deMutex_unlock(log->lock);
	return DE_TRUE;
}